

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

string * __thiscall
soul::CompileMessage::getAnnotatedSourceLine_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  LineAndColumn LVar1;
  size_t i;
  ulong uVar2;
  string indent;
  string sourceLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->location).location.data != (char *)0x0) {
    LVar1 = CodeLocation::getLineAndColumn(&this->location);
    if ((ulong)LVar1 >> 0x20 != 0) {
      CodeLocation::getSourceLine_abi_cxx11_(&sourceLine,&this->location);
      indent._M_dataplus._M_p = (pointer)&indent.field_2;
      indent._M_string_length = 0;
      indent.field_2._M_local_buf[0] = '\0';
      for (uVar2 = 0; LVar1.column - 1 != uVar2; uVar2 = uVar2 + 1) {
        std::__cxx11::string::push_back((char)&indent);
      }
      std::operator+(&local_70,&sourceLine,"\n");
      std::operator+(&local_50,&local_70,&indent);
      std::operator+(__return_storage_ptr__,&local_50,"^");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&indent);
      std::__cxx11::string::~string((string *)&sourceLine);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getAnnotatedSourceLine() const
{
    if (location.location.getAddress() != nullptr)
    {
        auto lc = location.getLineAndColumn();

        if (lc.column != 0)
        {
            auto sourceLine = location.getSourceLine();
            std::string indent;

            // because some fools insist on using tab characters, we need to make sure we mirror
            // any tabs in the original source line when indenting the '^' character, so that when
            // it's printed underneath it lines-up regardless of tab size
            for (size_t i = 0; i < lc.column - 1; ++i)
                indent += sourceLine[i] == '\t' ? '\t' : ' ';

            return sourceLine + "\n" + indent + "^";
        }
    }

    return {};
}